

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier-test-tools.cpp
# Opt level: O1

void __thiscall bezier::test::fuzzyCheckPoint(test *this,Point p,double x,double y,double epsilon)

{
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  AssertionHandler catchAssertionHandler;
  ScopedMessage scopedMessage1;
  double local_128;
  double local_120;
  MessageBuilder local_118;
  WithinAbsMatcher local_c0;
  ITransientExpression local_88;
  double *local_78;
  WithinAbsMatcher *local_70;
  ScopedMessage local_68;
  
  local_120 = p.y;
  local_128 = p.x;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x1bb009;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x5;
  macroName.m_size = 4;
  macroName.m_start = "INFO";
  Catch::MessageBuilder::MessageBuilder(&local_118,macroName,(SourceLineInfo *)&local_c0,Info);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_118.super_MessageStream.m_stream.m_oss,"Failure: fuzzyCheckPoint((",0x1a);
  std::ostream::_M_insert<double>(local_128);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_118.super_MessageStream.m_stream.m_oss,",",1);
  std::ostream::_M_insert<double>(local_120);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_118.super_MessageStream.m_stream.m_oss,"), ",3);
  std::ostream::_M_insert<double>(x);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_118.super_MessageStream.m_stream.m_oss,", ",2);
  std::ostream::_M_insert<double>(y);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_118.super_MessageStream.m_stream.m_oss,", ",2);
  std::ostream::_M_insert<double>(epsilon);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_118.super_MessageStream.m_stream.m_oss,");",2);
  Catch::ScopedMessage::ScopedMessage(&local_68,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_info.message._M_dataplus._M_p != &local_118.m_info.message.field_2) {
    operator_delete(local_118.m_info.message._M_dataplus._M_p,
                    local_118.m_info.message.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_118);
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x1bb009;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x6;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x2b;
  capturedExpression.m_start = "p.x, Catch::Matchers::WithinAbs(x, epsilon)";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_118,macroName_00,(SourceLineInfo *)&local_c0,
             capturedExpression,ContinueOnFailure);
  Catch::Matchers::WithinAbs(&local_c0,x,epsilon);
  local_88.m_result = Catch::Matchers::WithinAbsMatcher::match(&local_c0,&local_128);
  local_88.m_isBinaryExpression = true;
  local_88._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ec300;
  local_78 = &local_128;
  local_70 = &local_c0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_118,&local_88);
  Catch::ITransientExpression::~ITransientExpression(&local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_c0);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_118);
  if (local_118.m_info.message.field_2._M_local_buf[0xb] == '\0') {
    (**(code **)(*(long *)local_118.m_info.lineInfo.file + 0xa0))();
  }
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x1bb009;
  local_c0.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x7;
  macroName_01.m_size = 10;
  macroName_01.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x2b;
  capturedExpression_00.m_start = "p.y, Catch::Matchers::WithinAbs(y, epsilon)";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&local_118,macroName_01,(SourceLineInfo *)&local_c0,
             capturedExpression_00,ContinueOnFailure);
  Catch::Matchers::WithinAbs(&local_c0,y,epsilon);
  local_88.m_result = Catch::Matchers::WithinAbsMatcher::match(&local_c0,&local_120);
  local_88.m_isBinaryExpression = true;
  local_88._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ec300;
  local_78 = &local_120;
  local_70 = &local_c0;
  Catch::AssertionHandler::handleExpr((AssertionHandler *)&local_118,&local_88);
  Catch::ITransientExpression::~ITransientExpression(&local_88);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)&local_c0);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_118);
  if (local_118.m_info.message.field_2._M_local_buf[0xb] == '\0') {
    (**(code **)(*(long *)local_118.m_info.lineInfo.file + 0xa0))();
  }
  Catch::ScopedMessage::~ScopedMessage(&local_68);
  return;
}

Assistant:

void bezier::test::fuzzyCheckPoint(const ::bezier::Point p, const double x, const double y, const double epsilon)
{
    INFO("Failure: fuzzyCheckPoint((" << p.x << "," << p.y << "), " << x << ", " << y << ", " << epsilon << ");");
    CHECK_THAT(p.x, Catch::Matchers::WithinAbs(x, epsilon));
    CHECK_THAT(p.y, Catch::Matchers::WithinAbs(y, epsilon));
}